

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlTextWriterPtr xmlNewTextWriterFilename(char *uri,int compression)

{
  xmlOutputBufferPtr out_00;
  xmlOutputBufferPtr out;
  xmlTextWriterPtr ret;
  int compression_local;
  char *uri_local;
  
  out_00 = xmlOutputBufferCreateFilename(uri,(xmlCharEncodingHandlerPtr)0x0,compression);
  if (out_00 == (xmlOutputBufferPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_IO_EIO,"xmlNewTextWriterFilename : cannot open uri\n")
    ;
    uri_local = (char *)0x0;
  }
  else {
    uri_local = (char *)xmlNewTextWriter(out_00);
    if ((xmlTextWriterPtr)uri_local == (xmlTextWriterPtr)0x0) {
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_NO_MEMORY,
                      "xmlNewTextWriterFilename : out of memory!\n");
      xmlOutputBufferClose(out_00);
      uri_local = (char *)0x0;
    }
    else {
      ((xmlTextWriterPtr)uri_local)->indent = 0;
      ((xmlTextWriterPtr)uri_local)->doindent = 0;
    }
  }
  return (xmlTextWriterPtr)uri_local;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterFilename(const char *uri, int compression)
{
    xmlTextWriterPtr ret;
    xmlOutputBufferPtr out;

    out = xmlOutputBufferCreateFilename(uri, NULL, compression);
    if (out == NULL) {
        xmlWriterErrMsg(NULL, XML_IO_EIO,
                        "xmlNewTextWriterFilename : cannot open uri\n");
        return NULL;
    }

    ret = xmlNewTextWriter(out);
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlNewTextWriterFilename : out of memory!\n");
        xmlOutputBufferClose(out);
        return NULL;
    }

    ret->indent = 0;
    ret->doindent = 0;
    return ret;
}